

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O2

void BinarySink_put_mp_ssh2(BinarySink *bs,mp_int *x)

{
  BinarySink *bs_00;
  uint8_t val;
  size_t sVar1;
  ulong val_00;
  
  sVar1 = mp_get_nbits(x);
  val_00 = sVar1 + 8 >> 3;
  BinarySink_put_uint32(bs->binarysink_,val_00);
  while (val_00 = val_00 - 1, val_00 != 0xffffffffffffffff) {
    bs_00 = bs->binarysink_;
    val = mp_get_byte(x,val_00);
    BinarySink_put_byte(bs_00,val);
  }
  return;
}

Assistant:

void BinarySink_put_mp_ssh2(BinarySink *bs, mp_int *x)
{
    size_t bytes = (mp_get_nbits(x) + 8) / 8;

    put_uint32(bs, bytes);
    for (size_t i = bytes; i-- > 0 ;)
        put_byte(bs, mp_get_byte(x, i));
}